

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazySuccs
          (EnvironmentNAVXYTHETALAT *this,int SourceStateID,
          vector<int,_std::allocator<int>_> *SuccIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost,
          vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *actionV)

{
  pointer piVar1;
  pointer ppEVar2;
  EnvNAVXYTHETALATHashEntry_t *pEVar3;
  EnvNAVXYTHETALATAction_t *pEVar4;
  int iVar5;
  int iVar6;
  value_type_conflict1 *pvVar7;
  code *pcVar8;
  long lVar9;
  uint uVar10;
  long *plVar11;
  uint uVar12;
  long lVar13;
  int cost;
  vector<bool,_std::allocator<bool>_> *local_58;
  EnvNAVXYTHETALATAction_t *nav3daction;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *local_38;
  
  piVar1 = (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (SuccIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  piVar1 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  local_58 = isTrueCost;
  local_48 = SuccIDV;
  std::vector<int,_std::allocator<int>_>::reserve
            (SuccIDV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                           actionwidth);
  std::vector<int,_std::allocator<int>_>::reserve
            (CostV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth)
  ;
  std::vector<bool,_std::allocator<bool>_>::reserve
            (local_58,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                            actionwidth);
  if (actionV !=
      (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)0x0) {
    ppEVar2 = (actionV->
              super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((actionV->
        super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>)
        ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
      (actionV->
      super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = ppEVar2;
    }
    std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::reserve
              (actionV,(long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                             actionwidth);
  }
  if ((this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.goalstateid != SourceStateID) {
    pEVar3 = (this->StateID2CoordTable).
             super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
             ._M_impl.super__Vector_impl_data._M_start[SourceStateID];
    lVar9 = 0;
    local_40 = CostV;
    local_38 = actionV;
    for (lVar13 = 0;
        lVar13 < (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.actionwidth;
        lVar13 = lVar13 + 1) {
      pEVar4 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.ActionsV
               [(uint)(int)pEVar3->Theta];
      nav3daction = (EnvNAVXYTHETALATAction_t *)(&pEVar4->aind + lVar9);
      uVar10 = (int)(&pEVar4->dX)[lVar9] + pEVar3->X;
      uVar12 = (int)(&pEVar4->dY)[lVar9] + pEVar3->Y;
      iVar5 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x24])
                        (this,(ulong)(uint)(int)(&pEVar4->endtheta)[lVar9]);
      iVar6 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar10,(ulong)uVar12);
      if ((char)iVar6 != '\0') {
        if (local_38 ==
            (vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *)0x0)
        {
          pcVar8 = (code *)this->GetHashEntry;
          plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                    super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                            *(long *)&this->field_0x1c8);
          if (((ulong)pcVar8 & 1) != 0) {
            pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
          }
          pvVar7 = (value_type_conflict1 *)(*pcVar8)(plVar11,uVar10,uVar12,iVar5);
          if (pvVar7 == (value_type_conflict1 *)0x0) {
            pcVar8 = (code *)this->CreateNewHashEntry;
            plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                      super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation
                              + *(long *)&this->field_0x1d8);
            if (((ulong)pcVar8 & 1) != 0) {
              pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
            }
            pvVar7 = (value_type_conflict1 *)(*pcVar8)(plVar11,uVar10,uVar12,iVar5);
          }
          std::vector<int,_std::allocator<int>_>::push_back(local_48,pvVar7);
          cost = nav3daction->cost;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_40,&cost);
          std::vector<bool,_std::allocator<bool>_>::push_back(local_58,false);
        }
        else {
          cost = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
                   _vptr_DiscreteSpaceInformation[0x36])
                           (this,(ulong)(uint)pEVar3->X,(ulong)(uint)pEVar3->Y,
                            (ulong)(uint)(int)pEVar3->Theta,nav3daction);
          if (cost < 1000000000) {
            pcVar8 = (code *)this->GetHashEntry;
            plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                      super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation
                              + *(long *)&this->field_0x1c8);
            if (((ulong)pcVar8 & 1) != 0) {
              pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
            }
            pvVar7 = (value_type_conflict1 *)(*pcVar8)(plVar11,uVar10,uVar12,iVar5);
            if (pvVar7 == (value_type_conflict1 *)0x0) {
              pcVar8 = (code *)this->CreateNewHashEntry;
              plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                        super_DiscreteSpaceInformation.
                                        _vptr_DiscreteSpaceInformation + *(long *)&this->field_0x1d8
                                );
              if (((ulong)pcVar8 & 1) != 0) {
                pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
              }
              pvVar7 = (value_type_conflict1 *)(*pcVar8)(plVar11,uVar10,uVar12,iVar5);
            }
            std::vector<int,_std::allocator<int>_>::push_back(local_48,pvVar7);
            std::vector<int,_std::allocator<int>_>::push_back(local_40,&cost);
            std::vector<bool,_std::allocator<bool>_>::push_back(local_58,true);
            std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
            push_back(local_38,&nav3daction);
          }
        }
      }
      lVar9 = lVar9 + 0x68;
    }
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazySuccs(
    int SourceStateID,
    std::vector<int>* SuccIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost,
    std::vector<EnvNAVXYTHETALATAction_t*>* actionV)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // clear the successor array
    SuccIDV->clear();
    CostV->clear();
    SuccIDV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    CostV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    isTrueCost->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    if (actionV != NULL) {
        actionV->clear();
        actionV->reserve(EnvNAVXYTHETALATCfg.actionwidth);
    }

    // goal state should be absorbing
    if (SourceStateID == EnvNAVXYTHETALAT.goalstateid) {
        return;
    }

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[SourceStateID];

    // iterate through actions
    for (aind = 0; aind < EnvNAVXYTHETALATCfg.actionwidth; aind++) {
        EnvNAVXYTHETALATAction_t* nav3daction = &EnvNAVXYTHETALATCfg.ActionsV[(unsigned int)HashEntry->Theta][aind];
        int newX = HashEntry->X + nav3daction->dX;
        int newY = HashEntry->Y + nav3daction->dY;
        int newTheta = normalizeDiscAngle(nav3daction->endtheta);

        // skip the invalid cells
        if (!IsValidCell(newX, newY)) {
            continue;
        }

        // if we are supposed to return the action, then don't do lazy
        if (!actionV) {
            EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
            if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
                OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
            }
            SuccIDV->push_back(OutHashEntry->stateID);
            CostV->push_back(nav3daction->cost);
            isTrueCost->push_back(false);
            continue;
        }

        // get cost
        int cost = GetActionCost(HashEntry->X, HashEntry->Y, HashEntry->Theta, nav3daction);
        if (cost >= INFINITECOST) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(newX, newY, newTheta)) == NULL) {
            // have to create a new entry
            OutHashEntry = (this->*CreateNewHashEntry)(newX, newY, newTheta);
        }

        SuccIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(cost);
        isTrueCost->push_back(true);
        if (actionV != NULL) {
            actionV->push_back(nav3daction);
        }
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}